

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall amrex::TagBox::TagBox(TagBox *this,Box *bx,int n,Arena *ar)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_BaseFab<char>).super_DataAllocator.m_arena = ar;
  (this->super_BaseFab<char>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00714958;
  (this->super_BaseFab<char>).dptr = (char *)0x0;
  uVar1 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar2 = *(undefined8 *)(bx->bigend).vect;
  uVar3 = *(undefined8 *)((bx->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<char>).domain.smallend.vect =
       *(undefined8 *)(bx->smallend).vect;
  *(undefined8 *)((this->super_BaseFab<char>).domain.smallend.vect + 2) = uVar1;
  *(undefined8 *)(this->super_BaseFab<char>).domain.bigend.vect = uVar2;
  *(undefined8 *)((this->super_BaseFab<char>).domain.bigend.vect + 2) = uVar3;
  (this->super_BaseFab<char>).nvar = n;
  (this->super_BaseFab<char>).truesize = 0;
  (this->super_BaseFab<char>).ptr_owner = false;
  (this->super_BaseFab<char>).shared_memory = false;
  BaseFab<char>::define(&this->super_BaseFab<char>);
  (this->super_BaseFab<char>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00714898;
  return;
}

Assistant:

TagBox::TagBox (const Box& bx, int n, Arena* ar)
    : BaseFab<TagBox::TagType>(bx,n,ar)
{}